

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::absolute_pose::modules::upnp_main
               (Matrix<double,_10,_10,_0,_10,_10> *M,Matrix<double,_1,_10,_1,_1,_10> *C,double gamma
               ,vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *quaternions)

{
  bool bVar1;
  Scalar *this;
  Scalar *pSVar2;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>_>
  *pMVar3;
  Scalar *pSVar4;
  pointer ppVar5;
  pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_RDX;
  double in_XMM0_Qa;
  double dVar6;
  RealScalar RVar7;
  iterator qidx;
  double value;
  Matrix<double,_1,_1,_0,_1,_1> valueM;
  Matrix<double,_10,_1,_0,_10,_1> s_1;
  Vector4d diff;
  size_t s;
  bool alreadyThere;
  int q_1;
  int q;
  double norm;
  Vector4d quaternion;
  int i;
  double doubleSolThreshold;
  Matrix<std::complex<double>,_16,_16,_0,_16,_16> V;
  EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> Eig;
  Matrix<double,_16,_16,_0,_16,_16> Action;
  Matrix<double,_16,_16,_0,_16,_16> *in_stack_00018688;
  double in_stack_00018690;
  Matrix<double,_1,_10,_1,_1,_10> *in_stack_00018698;
  Matrix<double,_10,_10,_0,_10,_10> *in_stack_000186a0;
  value_type *in_stack_ffffffffffffb940;
  undefined4 in_stack_ffffffffffffb948;
  int in_stack_ffffffffffffb94c;
  const_iterator in_stack_ffffffffffffb950;
  undefined7 in_stack_ffffffffffffb958;
  undefined1 in_stack_ffffffffffffb95f;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>_>
  *this_00;
  MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_stack_ffffffffffffb968;
  MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_stack_ffffffffffffb970;
  StorageBaseType *in_stack_ffffffffffffb988;
  double *in_stack_ffffffffffffb990;
  undefined1 in_stack_ffffffffffffb99f;
  EigenBase<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> *in_stack_ffffffffffffb9a0;
  EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> *in_stack_ffffffffffffb9a8;
  __normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_4628;
  Matrix<double,_10,_1,_0,_10,_1> *in_stack_ffffffffffffb9e0;
  Vector4d *in_stack_ffffffffffffb9e8;
  EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> *in_stack_ffffffffffffbae0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>_>
  *local_44a0;
  int local_4490;
  int local_448c;
  MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *local_4488;
  int local_444c;
  
  Eigen::Matrix<double,_16,_16,_0,_16,_16>::Matrix((Matrix<double,_16,_16,_0,_16,_16> *)0x7ca5fd);
  upnp::setupAction_gj(in_stack_000186a0,in_stack_00018698,in_stack_00018690,in_stack_00018688);
  Eigen::EigenSolver<Eigen::Matrix<double,16,16,0,16,16>>::
  EigenSolver<Eigen::Matrix<double,16,16,0,16,16>>
            (in_stack_ffffffffffffb9a8,in_stack_ffffffffffffb9a0,(bool)in_stack_ffffffffffffb99f);
  Eigen::EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_>::eigenvectors
            (in_stack_ffffffffffffbae0);
  local_444c = 0;
  do {
    if (0xf < local_444c) {
      return;
    }
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7ca689);
    local_4488 = (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x0;
    for (local_448c = 0; local_448c < 4; local_448c = local_448c + 1) {
      this = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_16,_16,_0,_16,_16>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_16,_16,_0,_16,_16>,_1>
                         *)CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                        (Index)in_stack_ffffffffffffb940,0x7ca6d1);
      in_stack_ffffffffffffb970 =
           (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
           std::complex<double>::real_abi_cxx11_(this);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                          CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                          (Index)in_stack_ffffffffffffb940);
      *pSVar2 = (Scalar)in_stack_ffffffffffffb970;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                          CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                          (Index)in_stack_ffffffffffffb940);
      dVar6 = pow(*pSVar2,2.0);
      local_4488 = (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)(dVar6 + (double)local_4488)
      ;
    }
    local_4488 = (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)sqrt((double)local_4488);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                        (Index)in_stack_ffffffffffffb940);
    if (*pSVar2 < 0.0) {
      local_4488 = (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)((double)local_4488 * -1.0);
    }
    for (local_4490 = 0; local_4490 < 4; local_4490 = local_4490 + 1) {
      in_stack_ffffffffffffb968 = local_4488;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                          CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                          (Index)in_stack_ffffffffffffb940);
      *pSVar2 = *pSVar2 / (double)in_stack_ffffffffffffb968;
    }
    bVar1 = false;
    local_44a0 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>_>
                  *)0x0;
    while (this_00 = local_44a0,
          pMVar3 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>_>
                    *)std::
                      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                      ::size((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                              *)in_RDX), this_00 < pMVar3) {
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ::operator[]((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *)in_RDX,(size_type)local_44a0);
      Eigen::MatrixBase<Eigen::Matrix<double,4,1,0,4,1>>::operator-
                (in_stack_ffffffffffffb970,in_stack_ffffffffffffb968);
      Eigen::Matrix<double,4,1,0,4,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,4,1,0,4,1>const,Eigen::Matrix<double,4,1,0,4,1>const>>
                ((Matrix<double,_4,_1,_0,_4,_1> *)
                 CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                  *)in_stack_ffffffffffffb940);
      RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::norm
                        ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                         in_stack_ffffffffffffb940);
      if (RVar7 < 1e-08) {
        bVar1 = true;
        break;
      }
      local_44a0 = local_44a0 + 1;
    }
    if (!bVar1) {
      Eigen::Matrix<double,_10,_1,_0,_10,_1>::Matrix((Matrix<double,_10,_1,_0,_10,_1> *)0x7ca8db);
      upnp_fill_s(in_stack_ffffffffffffb9e8,in_stack_ffffffffffffb9e0);
      Eigen::DenseBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_> *)in_stack_ffffffffffffb940);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>>::operator*
                ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>_> *)
                 CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                 (MatrixBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffb940)
      ;
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Matrix<double,10,10,0,10,10>,0>>
      ::operator*((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>_>
                   *)CONCAT17(in_stack_ffffffffffffb95f,in_stack_ffffffffffffb958),
                  (MatrixBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_> *)
                  in_stack_ffffffffffffb950._M_current);
      in_stack_ffffffffffffb9e8 = (Vector4d *)0x4000000000000000;
      Eigen::operator*(in_stack_ffffffffffffb990,in_stack_ffffffffffffb988);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,10,1,1,10>const>const,Eigen::Matrix<double,1,10,1,1,10>const>>
      ::operator*(this_00,(MatrixBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_> *)
                          CONCAT17(in_stack_ffffffffffffb95f,in_stack_ffffffffffffb958));
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Matrix<double,10,10,0,10,10>,0>,Eigen::Matrix<double,10,1,0,10,1>,0>>
      ::operator+((MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>
                   *)in_stack_ffffffffffffb970,
                  (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>
                   *)in_stack_ffffffffffffb968);
      Eigen::Matrix<double,1,1,0,1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Matrix<double,10,10,0,10,10>,0>,Eigen::Matrix<double,10,1,0,10,1>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,10,1,1,10>const>const,Eigen::Matrix<double,1,10,1,1,10>const>,Eigen::Matrix<double,10,1,0,10,1>,0>const>>
                ((Matrix<double,_1,_1,_0,_1,_1> *)
                 CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>_>
                  *)in_stack_ffffffffffffb940);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1> *)
                          CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                          (Index)in_stack_ffffffffffffb940);
      in_stack_ffffffffffffb9e0 = (Matrix<double,_10,_1,_0,_10,_1> *)(*pSVar4 + in_XMM0_Qa);
      local_4628._M_current =
           (pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
           std::
           vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           ::begin((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *)in_stack_ffffffffffffb940);
      while( true ) {
        std::
        vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
        ::end((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
               *)in_stack_ffffffffffffb940);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                           (__normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                            *)in_stack_ffffffffffffb940);
        in_stack_ffffffffffffb95f = false;
        if (bVar1) {
          ppVar5 = __gnu_cxx::
                   __normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                   ::operator->(&local_4628);
          in_stack_ffffffffffffb95f = ppVar5->first < (double)in_stack_ffffffffffffb9e0;
        }
        if ((bool)in_stack_ffffffffffffb95f == false) break;
        __gnu_cxx::
        __normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
        ::operator++((__normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                      *)in_stack_ffffffffffffb950._M_current,in_stack_ffffffffffffb94c);
      }
      in_stack_ffffffffffffb950._M_current = in_RDX;
      __gnu_cxx::
      __normal_iterator<std::pair<double,Eigen::Matrix<double,4,1,0,4,1>>const*,std::vector<std::pair<double,Eigen::Matrix<double,4,1,0,4,1>>,Eigen::aligned_allocator<std::pair<double,Eigen::Matrix<double,4,1,0,4,1>>>>>
      ::__normal_iterator<std::pair<double,Eigen::Matrix<double,4,1,0,4,1>>*>
                ((__normal_iterator<const_std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                 (__normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                  *)in_stack_ffffffffffffb940);
      std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::
      pair<double_&,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_true>
                ((pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
                 &in_stack_ffffffffffffb940->first,(Matrix<double,_4,_1,_0,_4,_1> *)0x7caac0);
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ::insert((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffb94c,in_stack_ffffffffffffb948),
               in_stack_ffffffffffffb950,in_stack_ffffffffffffb940);
    }
    local_444c = local_444c + 1;
  } while( true );
}

Assistant:

void
opengv::absolute_pose::modules::upnp_main(
    const Eigen::Matrix<double,10,10> & M,
    const Eigen::Matrix<double,1,10> & C,
    double gamma,
    std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > & quaternions )
{
  Eigen::Matrix<double,16,16> Action;
  upnp::setupAction_gj( M, C, gamma, Action );
  Eigen::EigenSolver< Eigen::Matrix<double,16,16> > Eig( Action, true );
  Eigen::Matrix<std::complex<double>,16,16> V = Eig.eigenvectors();
  
  //cut the double solutions
  double doubleSolThreshold = 0.00000001;
  
  for( int i = 0; i < 16; i++ )
  {
    //we decided to drop the test for imaginary part
    //I've noticed that when the number of points is really low, things get a little
    //weary with noise, and complex solutions might actually be pretty good
    
    Eigen::Vector4d quaternion;
    double norm = 0.0;
    for( int q = 0; q < 4; q++ )
    {
      quaternion[q] = V(11+q,i).real();
      norm += pow(quaternion[q],2.0);
    }
    norm = sqrt(norm);
    if(quaternion[0] < 0) // this here is maybe risky, what if quaternion[0] is very small
      norm *= -1.0;
    for( int q = 0; q < 4; q++ )
      quaternion[q] /= norm;
    
    bool alreadyThere = false;
    for( size_t s = 0; s < quaternions.size(); s++ )
    {
      Eigen::Vector4d diff = quaternion - quaternions[s].second;
      if( diff.norm() < doubleSolThreshold )
      {
        alreadyThere = true;
        break;
      }
    }
    
    if( !alreadyThere )
    {
      Eigen::Matrix<double,10,1> s;
      upnp_fill_s(quaternion,s);
      Eigen::Matrix<double,1,1> valueM = s.transpose() * M * s + 2.0 * C * s;
      double value = valueM[0] + gamma;
      
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = quaternions.begin();
      while( qidx != quaternions.end() && qidx->first < value )
        qidx++;
      
      quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
  }
}